

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O1

void libomp_libomptarget_ompt_init(ompt_start_tool_result_t *result)

{
  __kmp_serial_initialize();
  if (((result != (ompt_start_tool_result_t *)0x0) && (((ulong)ompt_enabled & 1) != 0)) &&
     (ompt_callbacks.ompt_callback_device_initialize_callback !=
      (ompt_callback_device_initialize_t)0x0)) {
    (*result->initialize)(libomp_target_fn_lookup,0,(ompt_data_t *)0x0);
    libomptarget_ompt_result = result;
  }
  return;
}

Assistant:

_OMP_EXTERN void libomp_libomptarget_ompt_init(ompt_start_tool_result_t *result) {
  __ompt_force_initialization();

  if (ompt_enabled.enabled && 
      ompt_callbacks.ompt_callback(ompt_callback_device_initialize)) {
    if (result) {
      result->initialize(libomp_target_fn_lookup, 0, NULL); 
      libomptarget_ompt_result = result;
    }
  }
}